

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uchar **p;
  byte *pbVar4;
  byte bVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *local_48;
  
  pVal = *argv;
  uVar2._0_2_ = pVal->flags;
  uVar2._2_1_ = pVal->enc;
  uVar2._3_1_ = pVal->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
    return;
  }
  uVar7 = 1;
  local_48 = (char *)sqlite3ValueText(pVal,'\x01');
  if (local_48 == (char *)0x0) {
    return;
  }
  uVar2 = sqlite3ValueBytes(*argv,'\x01');
  uVar12 = (ulong)uVar2;
  if (argc == 1) {
    puVar9 = trimFunc::lenOne;
    p = trimFunc::azOne;
  }
  else {
    pbVar4 = (byte *)sqlite3ValueText(argv[1],'\x01');
    if (pbVar4 == (byte *)0x0) {
      return;
    }
    bVar5 = *pbVar4;
    if (bVar5 == 0) goto LAB_001b682f;
    uVar10 = 0;
    pbVar6 = pbVar4;
    do {
      if (bVar5 < 0xc0) {
        bVar5 = pbVar6[1];
      }
      else {
        bVar5 = pbVar6[1];
      }
      pbVar6 = pbVar6 + 1;
      uVar10 = uVar10 + 1;
    } while (bVar5 != 0);
    p = (uchar **)contextMalloc(context,(ulong)uVar10 * 0xc);
    if (p == (uchar **)0x0) {
      return;
    }
    if (*pbVar4 == 0) goto LAB_001b682f;
    puVar9 = (uint *)(p + uVar10);
    uVar7 = 0;
    do {
      p[uVar7] = pbVar4;
      pbVar6 = pbVar4 + 1;
      *(int *)((long)puVar9 + uVar7 * 4) = (int)pbVar6 - (int)pbVar4;
      uVar7 = uVar7 + 1;
      pbVar4 = pbVar6;
    } while (*pbVar6 != 0);
  }
  pvVar1 = context->pFunc->pUserData;
  if ((uVar2 != 0 & (byte)pvVar1) == 1) {
    do {
      uVar8 = 0;
      while( true ) {
        uVar10 = *(uint *)((long)puVar9 + uVar8 * 4);
        if ((uVar10 <= (uint)uVar12) && (iVar3 = bcmp(local_48,p[uVar8],(ulong)uVar10), iVar3 == 0))
        break;
        uVar8 = uVar8 + 1;
        if ((uVar7 & 0xffffffff) == uVar8) goto LAB_001b67be;
      }
      local_48 = local_48 + uVar10;
      uVar2 = 0;
      uVar10 = (uint)uVar12 - uVar10;
      uVar12 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  else {
LAB_001b67be:
    uVar2 = (uint)uVar12;
    if ((((ulong)pvVar1 & 2) != 0) && (uVar2 != 0)) {
LAB_001b67d3:
      uVar2 = (uint)uVar12;
      uVar8 = 0;
      do {
        uVar10 = *(uint *)((long)puVar9 + uVar8 * 4);
        if (uVar10 <= uVar2) {
          uVar11 = uVar2 - uVar10;
          uVar12 = (ulong)uVar11;
          iVar3 = bcmp(local_48 + uVar12,p[uVar8],(ulong)uVar10);
          if (iVar3 == 0) goto LAB_001b6807;
        }
        uVar8 = uVar8 + 1;
        if ((int)uVar7 + (uint)((int)uVar7 == 0) == uVar8) break;
      } while( true );
    }
  }
LAB_001b6814:
  if (argc != 1) {
    sqlite3_free(p);
  }
LAB_001b682f:
  setResultStrOrError(context,local_48,uVar2,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
LAB_001b6807:
  uVar2 = 0;
  if (uVar11 == 0) goto LAB_001b6814;
  goto LAB_001b67d3;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  unsigned int nIn;                 /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned int *aLen = 0;           /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = (unsigned)sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (unsigned*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context,
                     ((i64)nChar)*(sizeof(char*)+sizeof(unsigned)));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (unsigned)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}